

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<float> * __thiscall
TPZFMatrix<float>::operator+
          (TPZFMatrix<float> *__return_storage_ptr__,TPZFMatrix<float> *this,float value)

{
  float *pfVar1;
  float *pfVar2;
  
  TPZFMatrix(__return_storage_ptr__,this);
  pfVar2 = __return_storage_ptr__->fElem;
  pfVar1 = pfVar2 + (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol *
                    (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  for (; pfVar2 < pfVar1; pfVar2 = pfVar2 + 1) {
    *pfVar2 = *pfVar2 + value;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZFMatrix<TVar> TPZFMatrix<TVar>::operator+(const TVar value ) const {
    TPZFMatrix<TVar> res( *this );
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    
    TVar * dst = res.fElem,  *dstlast = dst+size;
    while ( dst < dstlast )
        *dst++ += value;
    
    return( res );
}